

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_NtkRunEco(char **pFileNames,int fCheck,int fRandom,int fInputs,int fVerbose,
                  int fVeryVerbose)

{
  uint uVar1;
  Acb_Ntk_t *pNtkF;
  Acb_Ntk_t *pNtkG;
  Vec_Ptr_t *pVVar2;
  Abc_Frame_t *pAbc;
  char *pcVar3;
  int iVar4;
  char Command [1000];
  
  pNtkF = Acb_VerilogSimpleRead(*pFileNames,pFileNames[2]);
  pNtkG = Acb_VerilogSimpleRead(pFileNames[1],(char *)0x0);
  if (pNtkG != (Acb_Ntk_t *)0x0 && pNtkF != (Acb_Ntk_t *)0x0) {
    if (fRandom != 0) {
      printf("Permuting targets as follows:   ");
      Vec_IntPermute(&pNtkF->vTargets);
      printf("Vector has %d entries: {",(ulong)(uint)(pNtkF->vTargets).nSize);
      for (iVar4 = 0; iVar4 < (pNtkF->vTargets).nSize; iVar4 = iVar4 + 1) {
        uVar1 = Vec_IntEntry(&pNtkF->vTargets,iVar4);
        printf(" %d",(ulong)uVar1);
      }
      puts(" }");
    }
    if ((pNtkF->vCis).nSize != (pNtkG->vCis).nSize) {
      __assert_fail("Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0xb1e,"void Acb_NtkRunEco(char **, int, int, int, int, int)");
    }
    if ((pNtkF->vCos).nSize != (pNtkG->vCos).nSize) {
      __assert_fail("Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0xb1f,"void Acb_NtkRunEco(char **, int, int, int, int, int)");
    }
    pVVar2 = Abc_FrameReadSignalNames();
    Acb_IntallLibrary((uint)(pVVar2 != (Vec_Ptr_t *)0x0));
    iVar4 = Acb_NtkEcoPerform(pNtkF,pNtkG,pFileNames,0,fInputs,fCheck,fVerbose,fVeryVerbose);
    if (iVar4 == 0) {
      puts("Computation did not succeed.");
      Acb_ManFree(pNtkF->pDesign);
      Acb_ManFree(pNtkG->pDesign);
      pcVar3 = "out.v";
      if (pFileNames[3] != (char *)0x0) {
        pcVar3 = pFileNames[3];
      }
      sprintf(Command,
              "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig"
              ,pFileNames[1],pcVar3);
    }
    else {
      Acb_ManFree(pNtkF->pDesign);
      Acb_ManFree(pNtkG->pDesign);
      pcVar3 = "out.v";
      if (pFileNames[3] != (char *)0x0) {
        pcVar3 = pFileNames[3];
      }
      sprintf(Command,
              "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig"
              ,pFileNames[1],pcVar3);
      pAbc = Abc_FrameGetGlobalFrame();
      iVar4 = Cmd_CommandExecute(pAbc,Command);
      if (iVar4 != 0) {
        fprintf(_stdout,"Cannot execute command \"%s\".\n",Command);
      }
    }
    putchar(10);
  }
  return;
}

Assistant:

void Acb_NtkRunEco( char * pFileNames[4], int fCheck, int fRandom, int fInputs, int fVerbose, int fVeryVerbose )
{
    char Command[1000]; int Result = 1;
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNames[0], pFileNames[2] );
    Acb_Ntk_t * pNtkG = Acb_VerilogSimpleRead( pFileNames[1], NULL );
    if ( !pNtkF || !pNtkG )
        return;
    //int * pArray = Vec_IntArray( &pNtkF->vTargets );
    //ABC_SWAP( int, pArray[7], pArray[4] );
    //Vec_IntReverseOrder( &pNtkF->vTargets );
    if ( fRandom )
    {
        printf( "Permuting targets as follows:   " );
        Vec_IntPermute( &pNtkF->vTargets );
        Vec_IntPrint( &pNtkF->vTargets );
    }
        
    assert( Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG) );
    assert( Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG) );

    Acb_IntallLibrary( Abc_FrameReadSignalNames() != NULL );

    if ( !Acb_NtkEcoPerform( pNtkF, pNtkG, pFileNames, 0, fInputs, fCheck, fVerbose, fVeryVerbose ) )
    {
//        printf( "General computation timed out. Trying inputs only.\n\n" );
//        if ( !Acb_NtkEcoPerform( pNtkF, pNtkG, pFileNames, 1, fInputs, fCheck, fVerbose, fVeryVerbose ) )
//            printf( "Input-only computation also timed out.\n\n" );
        printf( "Computation did not succeed.\n" );
        Result = 0;
    }

    Acb_ManFree( pNtkF->pDesign );
    Acb_ManFree( pNtkG->pDesign );

    // verify the result
    sprintf( Command, "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig", 
        pFileNames[1], pFileNames[3] ? pFileNames[3] : "out.v" );
    if ( Result && Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command ) )
        fprintf( stdout, "Cannot execute command \"%s\".\n", Command );
    printf( "\n" );
}